

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

int xmlListAppend(xmlListPtr l,void *data)

{
  int iVar1;
  _xmlLink *p_Var2;
  int iVar3;
  xmlLinkPtr pxVar4;
  
  iVar3 = 1;
  if (l != (xmlListPtr)0x0) {
    pxVar4 = l->sentinel;
    do {
      pxVar4 = pxVar4->prev;
      if (pxVar4 == l->sentinel) break;
      iVar1 = (*l->linkCompare)(pxVar4->data,data);
    } while (0 < iVar1);
    p_Var2 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var2 != (_xmlLink *)0x0) {
      p_Var2->data = data;
      p_Var2->next = pxVar4->next;
      pxVar4->next->prev = p_Var2;
      pxVar4->next = p_Var2;
      p_Var2->prev = pxVar4;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int xmlListAppend(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(1);
    lkPlace = xmlListHigherSearch(l, data);
    /* Add the new link */
    lkNew = (xmlLinkPtr) xmlMalloc(sizeof(xmlLink));
    if (lkNew == NULL)
        return (1);
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 0;
}